

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

Modes __thiscall ON_RenderChannels::Mode(ON_RenderChannels *this)

{
  ON_InternalXMLImpl *this_00;
  Modes MVar1;
  bool bVar2;
  wchar_t *path_to_node;
  ON_XMLVariant local_210;
  ON_XMLVariant local_118;
  undefined1 local_20 [8];
  ON_wString s;
  Modes mode;
  ON_RenderChannels *this_local;
  
  s.m_s._4_4_ = Automatic;
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_210,L"automatic");
  ON_InternalXMLImpl::GetParameter(&local_118,this_00,path_to_node,L"mode",&local_210);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_20);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_210);
  bVar2 = ::operator==(L"custom",(ON_wString *)local_20);
  if (bVar2) {
    s.m_s._4_4_ = Custom;
  }
  MVar1 = s.m_s._4_4_;
  ON_wString::~ON_wString((ON_wString *)local_20);
  return MVar1;
}

Assistant:

ON_RenderChannels::Modes ON_RenderChannels::Mode(void) const
{
  auto mode = Modes::Automatic;

  const ON_wString s = m_impl->GetParameter(XMLPath(), ON_RDK_RCH_MODE, ON_RDK_RCH_MODE_AUTOMATIC).AsString();
  if (ON_RDK_RCH_MODE_CUSTOM == s)
    mode = Modes::Custom;

  return mode;
}